

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitAnyTest_x_iutest_x_String_Test::Body(iu_UnitAnyTest_x_iutest_x_String_Test *this)

{
  bool bVar1;
  char *message;
  any *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_228;
  Fixed local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  any local_18;
  any a;
  iu_UnitAnyTest_x_iutest_x_String_Test *this_local;
  
  a.content = (placeholder *)this;
  iutest::any::any(&local_18,"test");
  iutest::detail::AlwaysZero();
  iutest::any_cast<std::__cxx11::string>(&local_70,(iutest *)&local_18,value);
  iutest::internal::backward::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((AssertionResult *)local_50,(EqHelper<false> *)"\"test\"",
             "::iutest::any_cast< ::std::string >(a)","test",(char (*) [5])&local_70,in_R9);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_1f8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f8);
    message = iutest::AssertionResult::message((AssertionResult *)local_50);
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
               ,0x34,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  iutest::any::~any(&local_18);
  return;
}

Assistant:

IUTEST(UnitAnyTest, String)
{
    ::iutest::any a = "test";
    IUTEST_EXPECT_EQ("test", ::iutest::any_cast< ::std::string >(a));
}